

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.h
# Opt level: O1

void __thiscall
Sphere::Sphere(Sphere *this,Vec3 *center,float radius,Material *material,bool animated,
              float animation_start,float animation_end)

{
  double dVar1;
  Vec3 local_30;
  undefined8 local_24;
  float local_1c;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Sphere_00121b70;
  (this->m_center).e[0] = center->e[0];
  (this->m_center).e[1] = center->e[1];
  (this->m_center).e[2] = center->e[2];
  this->m_radius = radius;
  this->m_material = material;
  this->m_animated = animated;
  this->m_animation_start = animation_start;
  this->m_animation_end = animation_end;
  dVar1 = drand48();
  local_30.e[1] = (float)dVar1 * (radius + radius);
  local_30.e[0] = 0.0;
  local_30.e[2] = 0.0;
  operator+(&this->m_center,&local_30);
  (this->m_center_end).e[2] = local_1c;
  *(undefined8 *)(this->m_center_end).e = local_24;
  return;
}

Assistant:

explicit Sphere(const Vec3& center, float radius, Material *material, bool animated=false, float animation_start=0.0f, float animation_end=1.0f) :
     m_center(center), m_radius(radius), m_material(material), m_animated(animated), m_animation_start(animation_start), m_animation_end(animation_end)
     { m_center_end = m_center + Vec3(0.0f, 2.0f*m_radius*RANDOM_GEN(), 0.0f); }